

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O1

void __thiscall QMakeInternal::QMakeBuiltin::QMakeBuiltin(QMakeBuiltin *this,QMakeBuiltinInit *d)

{
  char *pcVar1;
  uint uVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  storage_type *psVar10;
  int iVar11;
  int iVar12;
  storage_type *psVar13;
  long lVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QString local_138;
  QString local_120;
  QString local_108;
  QString local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  type local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->usage).d.d = (Data *)0x0;
  (this->usage).d.ptr = (char16_t *)0x0;
  (this->usage).d.size = 0;
  this->index = d->func;
  iVar11 = 0;
  if (0 < d->min_args) {
    iVar11 = d->min_args;
  }
  this->minArgs = iVar11;
  iVar11 = d->max_args;
  lVar14 = (long)iVar11;
  this->maxArgs = iVar11;
  uVar2 = d->min_args;
  uVar6 = -uVar2;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  if (lVar14 == 1000) {
    if (uVar6 != 1) goto LAB_00261c67;
    QVar15.m_data = (storage_type *)0x26;
    QVar15.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar15);
    if (d->name == (char *)0x0) {
      psVar13 = (storage_type *)0x0;
    }
    else {
      psVar10 = (storage_type *)0xffffffffffffffff;
      do {
        psVar13 = psVar10 + 1;
        pcVar1 = psVar10 + (long)(d->name + 1);
        psVar10 = psVar13;
      } while (*pcVar1 != '\0');
    }
    QVar19.m_data = psVar13;
    QVar19.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar19);
    if (d->args == (char *)0x0) {
      psVar13 = (storage_type *)0x0;
    }
    else {
      psVar10 = (storage_type *)0xffffffffffffffff;
      do {
        psVar13 = psVar10 + 1;
        pcVar1 = d->args + 1 + (long)psVar10;
        psVar10 = psVar13;
      } while (*pcVar1 != '\0');
    }
    QVar21.m_data = psVar13;
    QVar21.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar21);
    QString::arg<QString,QString>(&local_48,&local_60,&local_78,&local_90);
    local_a8.d.d = (this->usage).d.d;
    pcVar3 = (this->usage).d.ptr;
    *(undefined4 *)&(this->usage).d.d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(this->usage).d.d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(this->usage).d.ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->usage).d.ptr + 4) = local_48.d.ptr._4_4_;
    qVar4 = (this->usage).d.size;
    (this->usage).d.size = local_48.d.size;
    local_48.d.d = local_a8.d.d;
    local_48.d.ptr = pcVar3;
    local_48.d.size = qVar4;
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
      goto LAB_00261bec;
LAB_00261bdd:
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  else {
    iVar12 = iVar11 - uVar6;
    if (iVar12 < 2) {
      if (iVar12 == 1) {
        QVar17.m_data = (storage_type *)0x23;
        QVar17.m_size = (qsizetype)&local_d8;
        QString::fromLatin1(QVar17);
        if (d->name == (char *)0x0) {
          psVar13 = (storage_type *)0x0;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            psVar13 = psVar10 + 1;
            pcVar1 = psVar10 + (long)(d->name + 1);
            psVar10 = psVar13;
          } while (*pcVar1 != '\0');
        }
        QVar26.m_data = psVar13;
        QVar26.m_size = (qsizetype)&local_f0;
        QString::fromLatin1(QVar26);
        if (d->args == (char *)0x0) {
          psVar13 = (storage_type *)0x0;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            psVar13 = psVar10 + 1;
            pcVar1 = d->args + 1 + (long)psVar10;
            psVar10 = psVar13;
          } while (*pcVar1 != '\0');
        }
        QVar27.m_data = psVar13;
        QVar27.m_size = (qsizetype)&local_108;
        QString::fromLatin1(QVar27);
        psVar13 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar13 + (long)(QMakeBuiltin::nstr[uVar6] + 1);
          psVar13 = psVar13 + 1;
        } while (*pcVar1 != '\0');
        QVar28.m_data = psVar13;
        QVar28.m_size = (qsizetype)&local_120;
        QString::fromLatin1(QVar28);
        psVar13 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar13 + (long)(QMakeBuiltin::nstr[lVar14] + 1);
          psVar13 = psVar13 + 1;
        } while (*pcVar1 != '\0');
        QVar29.m_data = psVar13;
        QVar29.m_size = (qsizetype)&local_138;
        QString::fromLatin1(QVar29);
        QString::arg<QString,QString,QString,QString>
                  (&local_48,&local_d8,&local_f0,&local_108,&local_120,&local_138);
        bVar9 = true;
        goto LAB_0026197d;
      }
      if (iVar11 != 1) {
        QVar25.m_data = (storage_type *)0x1d;
        QVar25.m_size = (qsizetype)&local_d8;
        QString::fromLatin1(QVar25);
        if (d->name == (char *)0x0) {
          psVar13 = (storage_type *)0x0;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            psVar13 = psVar10 + 1;
            pcVar1 = psVar10 + (long)(d->name + 1);
            psVar10 = psVar13;
          } while (*pcVar1 != '\0');
        }
        QVar31.m_data = psVar13;
        QVar31.m_size = (qsizetype)&local_f0;
        QString::fromLatin1(QVar31);
        if (d->args == (char *)0x0) {
          psVar13 = (storage_type *)0x0;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            psVar13 = psVar10 + 1;
            pcVar1 = d->args + 1 + (long)psVar10;
            psVar10 = psVar13;
          } while (*pcVar1 != '\0');
        }
        QVar33.m_data = psVar13;
        QVar33.m_size = (qsizetype)&local_108;
        QString::fromLatin1(QVar33);
        psVar13 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar13 + (long)(QMakeBuiltin::nstr[lVar14] + 1);
          psVar13 = psVar13 + 1;
        } while (*pcVar1 != '\0');
        QVar34.m_data = psVar13;
        QVar34.m_size = (qsizetype)&local_120;
        QString::fromLatin1(QVar34);
        QString::arg<QString,QString,QString>(&local_48,&local_d8,&local_f0,&local_108,&local_120);
        bVar8 = true;
        bVar9 = false;
        goto LAB_00261980;
      }
      QVar18.m_data = (storage_type *)0x1d;
      QVar18.m_size = (qsizetype)&local_d8;
      QString::fromLatin1(QVar18);
      if (d->name == (char *)0x0) {
        psVar13 = (storage_type *)0x0;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          psVar13 = psVar10 + 1;
          pcVar1 = psVar10 + (long)(d->name + 1);
          psVar10 = psVar13;
        } while (*pcVar1 != '\0');
      }
      QVar30.m_data = psVar13;
      QVar30.m_size = (qsizetype)&local_f0;
      QString::fromLatin1(QVar30);
      if (d->args == (char *)0x0) {
        psVar13 = (storage_type *)0x0;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          psVar13 = psVar10 + 1;
          pcVar1 = d->args + 1 + (long)psVar10;
          psVar10 = psVar13;
        } while (*pcVar1 != '\0');
      }
      QVar32.m_data = psVar13;
      QVar32.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar32);
      QString::arg<QString,QString>(&local_48,&local_d8,&local_f0,&local_108);
      bVar7 = true;
      bVar9 = false;
      bVar8 = false;
    }
    else {
      QVar16.m_data = (storage_type *)0x23;
      QVar16.m_size = (qsizetype)&local_60;
      QString::fromLatin1(QVar16);
      if (d->name == (char *)0x0) {
        psVar13 = (storage_type *)0x0;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          psVar13 = psVar10 + 1;
          pcVar1 = psVar10 + (long)(d->name + 1);
          psVar10 = psVar13;
        } while (*pcVar1 != '\0');
      }
      QVar20.m_data = psVar13;
      QVar20.m_size = (qsizetype)&local_78;
      QString::fromLatin1(QVar20);
      if (d->args == (char *)0x0) {
        psVar13 = (storage_type *)0x0;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          psVar13 = psVar10 + 1;
          pcVar1 = d->args + 1 + (long)psVar10;
          psVar10 = psVar13;
        } while (*pcVar1 != '\0');
      }
      QVar22.m_data = psVar13;
      QVar22.m_size = (qsizetype)&local_90;
      QString::fromLatin1(QVar22);
      psVar13 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar13 + (long)(QMakeBuiltin::nstr[uVar6] + 1);
        psVar13 = psVar13 + 1;
      } while (*pcVar1 != '\0');
      QVar23.m_data = psVar13;
      QVar23.m_size = (qsizetype)&local_a8;
      QString::fromLatin1(QVar23);
      psVar13 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar13 + (long)(QMakeBuiltin::nstr[lVar14] + 1);
        psVar13 = psVar13 + 1;
      } while (*pcVar1 != '\0');
      QVar24.m_data = psVar13;
      QVar24.m_size = (qsizetype)&local_c0;
      QString::fromLatin1(QVar24);
      QString::arg<QString,QString,QString,QString>
                (&local_48,&local_60,&local_78,&local_90,&local_a8,&local_c0);
      bVar9 = false;
LAB_0026197d:
      bVar8 = false;
LAB_00261980:
      bVar7 = false;
    }
    pQVar5 = &((this->usage).d.d)->super_QArrayData;
    pcVar3 = (this->usage).d.ptr;
    *(undefined4 *)&(this->usage).d.d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(this->usage).d.d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(this->usage).d.ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->usage).d.ptr + 4) = local_48.d.ptr._4_4_;
    qVar4 = (this->usage).d.size;
    (this->usage).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar5;
    local_48.d.ptr = pcVar3;
    local_48.d.size = qVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (bVar8) {
      if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (bVar9) {
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (iVar12 < 2) goto LAB_00261c67;
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      goto LAB_00261bdd;
    }
  }
LAB_00261bec:
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00261c67:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMakeBuiltin::QMakeBuiltin(const QMakeBuiltinInit &d)
    : index(d.func), minArgs(qMax(0, d.min_args)), maxArgs(d.max_args)
{
    static const char * const nstr[6] = { "no", "one", "two", "three", "four", "five" };
    // For legacy reasons, there is actually no such thing as "no arguments"
    // - there is only "empty first argument", which needs to be mapped back.
    // -1 means "one, which may be empty", which is effectively zero, except
    // for the error message if there are too many arguments.
    int dmin = qAbs(d.min_args);
    int dmax = d.max_args;
    if (dmax == QMakeBuiltinInit::VarArgs) {
        Q_ASSERT_X(dmin < 2, "init", d.name);
        if (dmin == 1) {
            Q_ASSERT_X(d.args != nullptr, "init", d.name);
            usage = fL1S("%1(%2) requires at least one argument.")
                    .arg(fL1S(d.name), fL1S(d.args));
        }
        return;
    }
    int arange = dmax - dmin;
    Q_ASSERT_X(arange >= 0, "init", d.name);
    Q_ASSERT_X(d.args != nullptr, "init", d.name);
    usage = arange > 1
               ? fL1S("%1(%2) requires %3 to %4 arguments.")
                 .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
               : arange > 0
                   ? fL1S("%1(%2) requires %3 or %4 arguments.")
                     .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
                   : dmax != 1
                       ? fL1S("%1(%2) requires %3 arguments.")
                         .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmax]))
                       : fL1S("%1(%2) requires one argument.")
                         .arg(fL1S(d.name), fL1S(d.args));
}